

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_srst(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  ulong uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  uintptr_t unaff_retaddr;
  
  uVar1 = env->regs[0];
  if ((uVar1 & 0xffffff00) != 0) {
    tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
  }
  uVar3 = get_address(env,r2);
  uVar4 = get_address(env,r1);
  lVar5 = 0;
  do {
    if (lVar5 == 0x2000) {
      env->cc_op = 3;
      uVar3 = uVar3 + 0x2000;
      r1 = r2;
      goto LAB_00ae08dd;
    }
    if ((uVar3 - uVar4) + lVar5 == 0) {
      env->cc_op = 2;
      return;
    }
    uVar2 = cpu_ldub_data_ra_s390x(env,uVar3 + lVar5,unaff_retaddr);
    lVar5 = lVar5 + 1;
  } while ((uVar2 & 0xff) != (uint)uVar1);
  env->cc_op = 1;
  uVar3 = (uVar3 + lVar5) - 1;
LAB_00ae08dd:
  set_address(env,r1,uVar3);
  return;
}

Assistant:

void HELPER(srst)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    uintptr_t ra = GETPC();
    uint64_t end, str;
    uint32_t len;
    uint8_t v, c = env->regs[0];

    /* Bits 32-55 must contain all 0.  */
    if (env->regs[0] & 0xffffff00u) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    str = get_address(env, r2);
    end = get_address(env, r1);

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  For now, let's cap at 8k.  */
    for (len = 0; len < 0x2000; ++len) {
        if (str + len == end) {
            /* Character not found.  R1 & R2 are unmodified.  */
            env->cc_op = 2;
            return;
        }
        v = cpu_ldub_data_ra(env, str + len, ra);
        if (v == c) {
            /* Character found.  Set R1 to the location; R2 is unmodified.  */
            env->cc_op = 1;
            set_address(env, r1, str + len);
            return;
        }
    }

    /* CPU-determined bytes processed.  Advance R2 to next byte to process.  */
    env->cc_op = 3;
    set_address(env, r2, str + len);
}